

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeAnyTypeUrl
          (ParserImpl *this,string *full_type_name,string *prefix)

{
  string *psVar1;
  bool bVar2;
  AlphaNum local_140;
  allocator<char> local_109;
  string local_108;
  AlphaNum local_e8;
  AlphaNum local_b8;
  uint local_84;
  undefined1 local_80 [8];
  string url;
  allocator<char> local_49;
  string local_48;
  string *local_28;
  string *prefix_local;
  string *full_type_name_local;
  ParserImpl *this_local;
  
  local_28 = prefix;
  prefix_local = full_type_name;
  full_type_name_local = (string *)this;
  bVar2 = ConsumeIdentifier(this,prefix);
  if (bVar2) {
    do {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,".",&local_49);
      bVar2 = TryConsume(this,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::allocator<char>::~allocator(&local_49);
      if (!bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"/",&local_109);
        bVar2 = Consume(this,&local_108);
        std::__cxx11::string::~string((string *)&local_108);
        std::allocator<char>::~allocator(&local_109);
        psVar1 = local_28;
        if (bVar2) {
          absl::lts_20250127::AlphaNum::AlphaNum(&local_140,"/");
          absl::lts_20250127::StrAppend(psVar1,&local_140);
          bVar2 = ConsumeFullTypeName(this,prefix_local);
          if (bVar2) {
            this_local._7_1_ = 1;
          }
          else {
            this_local._7_1_ = 0;
          }
        }
        else {
          this_local._7_1_ = 0;
        }
        break;
      }
      std::__cxx11::string::string((string *)local_80);
      bVar2 = ConsumeIdentifier(this,(string *)local_80);
      psVar1 = local_28;
      if (bVar2) {
        absl::lts_20250127::AlphaNum::AlphaNum(&local_b8,".");
        absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
                  (&local_e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
        absl::lts_20250127::StrAppend(psVar1,&local_b8,&local_e8);
      }
      else {
        this_local._7_1_ = 0;
      }
      local_84 = (uint)!bVar2;
      std::__cxx11::string::~string((string *)local_80);
    } while (local_84 == 0);
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ConsumeAnyTypeUrl(std::string* full_type_name, std::string* prefix) {
    // TODO Extend Consume() to consume multiple tokens at once, so that
    // this code can be written as just DO(Consume(kGoogleApisTypePrefix)).
    DO(ConsumeIdentifier(prefix));
    while (TryConsume(".")) {
      std::string url;
      DO(ConsumeIdentifier(&url));
      absl::StrAppend(prefix, ".", url);
    }
    DO(Consume("/"));
    absl::StrAppend(prefix, "/");
    DO(ConsumeFullTypeName(full_type_name));

    return true;
  }